

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true> __thiscall
duckdb::Deserializer::
ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ReservoirChunk,std::default_delete<duckdb::ReservoirChunk>,true>>
          (Deserializer *this,field_id_t field_id,char *tag)

{
  char cVar1;
  undefined6 in_register_00000032;
  long *plVar2;
  __uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_> local_18;
  
  plVar2 = (long *)CONCAT62(in_register_00000032,field_id);
  cVar1 = (**(code **)(*plVar2 + 0x20))(plVar2,(ulong)tag & 0xffffffff);
  if (cVar1 == '\0') {
    (**(code **)(*plVar2 + 0x28))(plVar2,0);
    this->_vptr_Deserializer = (_func_int **)0x0;
    local_18._M_t.
    super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>.
    super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl =
         (tuple<duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>)
         (_Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>)
         0x0;
    ::std::unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>::
    ~unique_ptr((unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_> *)
                &local_18);
  }
  else {
    Read<duckdb::unique_ptr<duckdb::ReservoirChunk,std::default_delete<duckdb::ReservoirChunk>,true>,duckdb::ReservoirChunk>
              (this);
    (**(code **)(*plVar2 + 0x28))(plVar2,1);
  }
  return (unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>)
         (unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>)this;
}

Assistant:

inline T ReadPropertyWithDefault(const field_id_t field_id, const char *tag) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(SerializationDefaultValue::GetDefault<T>());
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}